

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Descriptor.cpp
# Opt level: O2

TypeDescriptor * modDivOperator(TypeDescriptor *leftValue,TypeDescriptor *rightValue)

{
  types tVar1;
  NumberDescriptor *this;
  ostream *poVar2;
  double value;
  string local_60 [32];
  string local_40 [32];
  
  if (leftValue->_type == NUMBER) {
    tVar1 = rightValue->_type;
    if (tVar1 == NUMBER) {
      this = (NumberDescriptor *)operator_new(0x60);
      value = fmod(leftValue->_number,rightValue->_number);
      NumberDescriptor::NumberDescriptor(this,value);
      return &this->super_TypeDescriptor;
    }
LAB_0010e4de:
    if (tVar1 != STRING) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Unknown type. Terminating...");
      std::endl<char,std::char_traits<char>>(poVar2);
      goto LAB_0010e5fe;
    }
  }
  else if (leftValue->_type != STRING) {
    tVar1 = rightValue->_type;
    goto LAB_0010e4de;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"TypeDescriptor *modDivOperator: ");
  std::__cxx11::string::string(local_40,(string *)&leftValue->_string);
  poVar2 = std::operator<<(poVar2,local_40);
  poVar2 = std::operator<<(poVar2," % ");
  std::__cxx11::string::string(local_60,(string *)&rightValue->_string);
  poVar2 = std::operator<<(poVar2,local_60);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_40);
  poVar2 = std::operator<<((ostream *)&std::cout,"Cannot do modular division:");
  std::__cxx11::string::string(local_40,(string *)&leftValue->_string);
  poVar2 = std::operator<<(poVar2,local_40);
  poVar2 = std::operator<<(poVar2," % ");
  std::__cxx11::string::string(local_60,(string *)&rightValue->_string);
  poVar2 = std::operator<<(poVar2,local_60);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_40);
LAB_0010e5fe:
  exit(2);
}

Assistant:

TypeDescriptor *modDivOperator(TypeDescriptor *leftValue, TypeDescriptor *rightValue){
    if(leftValue->type() == TypeDescriptor::NUMBER
    && rightValue->type() == TypeDescriptor::NUMBER){
        auto *remainder = new  NumberDescriptor(fmod(leftValue->getNumber(), rightValue->getNumber()));
        //std::cout << "TypeDescriptor *modDivOperator: " << leftValue->getNumber() << " % " << rightValue->getNumber() << std::endl;
        return remainder;
    }else if(leftValue->type() == TypeDescriptor::STRING
    || rightValue->type() == TypeDescriptor::STRING ){

        std::cout << "TypeDescriptor *modDivOperator: " << leftValue->getString()  << " % " << rightValue->getString()  << std::endl;
        std::cout << "Cannot do modular division:" << leftValue->getString()  << " % " << rightValue->getString()  << std::endl;
        exit(2);
    }else{
        std::cout << "Unknown type. Terminating..." << std::endl;
        exit(2);
    }
}